

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

_Bool mi_heap_buf_expand(mi_heap_buf_t *hbuf)

{
  void *pvVar1;
  long *in_RDI;
  char *newbuf;
  size_t newsize;
  size_t newsize_00;
  void *in_stack_ffffffffffffffe0;
  _Bool local_1;
  
  if (in_RDI == (long *)0x0) {
    local_1 = false;
  }
  else {
    if ((*in_RDI != 0) && (in_RDI[1] != 0)) {
      *(undefined1 *)(*in_RDI + in_RDI[1] + -1) = 0;
    }
    if (((ulong)in_RDI[1] < 0x8000000000000000) && ((*(byte *)(in_RDI + 3) & 1) != 0)) {
      if (in_RDI[1] == 0) {
        newsize_00 = 0x800;
      }
      else {
        newsize_00 = in_RDI[1] << 1;
      }
      pvVar1 = mi_rezalloc(in_stack_ffffffffffffffe0,newsize_00);
      if (pvVar1 == (void *)0x0) {
        local_1 = false;
      }
      else {
        *in_RDI = (long)pvVar1;
        in_RDI[1] = newsize_00;
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool mi_heap_buf_expand(mi_heap_buf_t* hbuf) {
  if (hbuf==NULL) return false;
  if (hbuf->buf != NULL && hbuf->size>0) {
    hbuf->buf[hbuf->size-1] = 0;
  }
  if (hbuf->size > SIZE_MAX/2 || !hbuf->can_realloc) return false;
  const size_t newsize = (hbuf->size == 0 ? 2*MI_KiB : 2*hbuf->size);
  char* const  newbuf  = (char*)mi_rezalloc(hbuf->buf, newsize);
  if (newbuf == NULL) return false;
  hbuf->buf = newbuf;
  hbuf->size = newsize;
  return true;
}